

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cl.c
# Opt level: O2

my_options_t * my_program_options_new(void)

{
  my_options_t *pmVar1;
  
  pmVar1 = (my_options_t *)malloc(0x60);
  pmVar1->how_many = 0x14;
  pmVar1->last_n_words = 100;
  pmVar1->min_length = 3;
  pmVar1->every_steps = 1;
  pmVar1->ignore_case = 0;
  pmVar1->success = 1;
  pmVar1->print_options = 0;
  pmVar1->do_timing = 0;
  return pmVar1;
}

Assistant:

my_options_t *my_program_options_new()
{
    my_options_t* options =  (my_options_t *) malloc(sizeof(my_options_t));
    options->last_n_words = 100;
    options->how_many = 20;
    options->min_length = 3;
    options->success = 1;
    options->print_options = 0;
    options->every_steps = 1;
    options->ignore_case = 0;
    options->do_timing = 0;
    return options;
}